

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O0

void __thiscall
leveldb::FilterBlockBuilder::FilterBlockBuilder(FilterBlockBuilder *this,FilterPolicy *policy)

{
  FilterPolicy *policy_local;
  FilterBlockBuilder *this_local;
  
  this->policy_ = policy;
  std::__cxx11::string::string((string *)&this->keys_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->start_);
  std::__cxx11::string::string((string *)&this->result_);
  std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::vector(&this->tmp_keys_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->filter_offsets_);
  return;
}

Assistant:

FilterBlockBuilder::FilterBlockBuilder(const FilterPolicy* policy)
    : policy_(policy) {}